

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O0

Directory *
CompoundFile::loadChildDir
          (map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
           *dirs,int32_t dirID,Stream *stream)

{
  size_type sVar1;
  mapped_type *pmVar2;
  long *in_RDX;
  int in_ESI;
  Stream *in_stack_00000008;
  Directory *in_stack_00000010;
  Directory dir;
  Directory *in_stack_ffffffffffffff78;
  Directory *in_stack_ffffffffffffff80;
  key_type *in_stack_ffffffffffffff88;
  map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
  *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  
  if ((in_ESI != -1) &&
     (sVar1 = std::
              map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
              ::count(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88), sVar1 == 0)) {
    (**(code **)(*in_RDX + 0x20))(in_RDX,in_ESI << 7,0);
    Directory::Directory((Directory *)&stack0xffffffffffffffa8);
    Directory::load(in_stack_00000010,in_stack_00000008);
    std::
    map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
    ::operator[]((map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
                  *)in_stack_ffffffffffffffc0,(key_type *)in_stack_ffffffffffffffb8);
    Directory::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    pmVar2 = std::
             map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
             ::operator[]((map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
                           *)in_stack_ffffffffffffffc0,(key_type *)in_stack_ffffffffffffffb8);
    Directory::~Directory((Directory *)0x132044);
    return pmVar2;
  }
  return (Directory *)0x0;
}

Assistant:

inline Directory *
loadChildDir( std::map< int32_t, Directory > & dirs,
	int32_t dirID, Stream & stream )
{
	if( dirID != -1 && dirs.count(dirID) == 0 )
	{
		stream.seek( dirID * dirRecordSize, Stream::FromBeginning );

		Directory dir;
		dir.load( stream );

		dirs[ dirID ] = dir;

		return &dirs[ dirID ];
	}

	return nullptr;
}